

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void draw_msgwin(void)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  attr_t aVar4;
  wchar_t wVar5;
  WINDOW *pWVar6;
  int iVar7;
  wchar_t wVar8;
  
  if (msgwin == (WINDOW *)0x0) {
    pWVar6 = (WINDOW *)0x0;
  }
  else {
    pWVar6 = msgwin;
    if (-1 < msgwin->_maxy) {
      bVar2 = false;
      iVar7 = (int)msgwin->_maxy;
      do {
        pWVar6 = msgwin;
        if (msgwin == (WINDOW *)0x0) {
          uVar3 = 1;
        }
        else {
          uVar3 = ~(int)msgwin->_maxy;
        }
        wVar5 = iVar7 + uVar3 + curline + L'\x01';
        wVar8 = iVar7 + 0x29 + uVar3 + curline;
        if (L'\xffffffff' < wVar5) {
          wVar8 = wVar5;
        }
        if ((wVar8 == start_of_turn_curline) && (bVar2 = true, settings.darkmsg != '\0')) {
          aVar4 = curses_color_attr(4,0);
          wattr_on(pWVar6,aVar4,0);
        }
        wmove(msgwin,iVar7,0);
        waddnstr(msgwin,msglines + wVar8,0xffffffff);
        if (((msgwin == (WINDOW *)0x0) || (msgwin->_curx != 0)) || (msglines[wVar8][0] == '\0')) {
          wclrtoeol(msgwin);
        }
        pWVar6 = msgwin;
        bVar1 = 0 < iVar7;
        iVar7 = iVar7 + -1;
      } while (bVar1);
      if (bVar2) {
        if (settings.darkmsg != '\0') {
          aVar4 = curses_color_attr(4,0);
          wattr_off(pWVar6,aVar4,0);
          pWVar6 = msgwin;
        }
        goto LAB_0010e685;
      }
    }
  }
  start_of_turn_curline = L'\xffffffff';
LAB_0010e685:
  wnoutrefresh(pWVar6);
  return;
}

Assistant:

void draw_msgwin(void)
{
    int i, pos;
    nh_bool drew_older = FALSE;

    for (i = getmaxy(msgwin) - 1; i >= 0; i--) {
	pos = curline - getmaxy(msgwin) + 1 + i;
	if (pos < 0)
	    pos += MAX_MSGLINES;
	if (pos == start_of_turn_curline) {
	    if (settings.darkmsg)
		wattron(msgwin, curses_color_attr(CLR_BLUE, 0));
	    drew_older = TRUE;
	}
	wmove(msgwin, i, 0);
	waddstr(msgwin, msglines[pos]);
	/* Only clear the remainder of the line if the cursor did not wrap. */
	if (getcurx(msgwin) || !*msglines[pos])
	    wclrtoeol(msgwin);
    }

    if (drew_older) {
	if (settings.darkmsg)
	    wattroff(msgwin, curses_color_attr(CLR_BLUE, 0));
    } else {
	/* Don't dim out messages if the message buffer wraps. */
	start_of_turn_curline = -1;
    }

    wnoutrefresh(msgwin);
}